

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvhz.cpp
# Opt level: O2

void UConverter_toUnicode_HZ_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  long *plVar4;
  uint uVar5;
  int8_t iVar6;
  UConverter *pUVar7;
  uint8_t uVar8;
  short sVar9;
  UChar *pUVar11;
  byte *pbVar12;
  int iVar13;
  byte *pbVar14;
  char tempBuf [2];
  uint uVar10;
  
  pUVar7 = args->converter;
  pbVar12 = (byte *)args->source;
  pUVar11 = args->target;
  pbVar3 = (byte *)args->sourceLimit;
  plVar4 = (long *)pUVar7->extraInfo;
  pbVar14 = pbVar12;
LAB_002ad4ff:
  do {
    if (pbVar3 <= pbVar12) {
LAB_002ad6e3:
      args->target = pUVar11;
      args->source = (char *)pbVar12;
      return;
    }
    if (args->targetLimit <= pUVar11) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_002ad6e3;
    }
    bVar1 = *pbVar12;
    uVar10 = (uint)bVar1;
    iVar13 = (int)pbVar14;
    if (pUVar7->mode == 0x7e) {
      pUVar7->mode = 0;
      if (bVar1 != 10) {
        if ((bVar1 != 0x7b) && (uVar10 != 0x7d)) {
          if (uVar10 == 0x7e) {
            if (args->offsets != (int32_t *)0x0) {
              *(uint *)((long)args->offsets + ((long)pUVar11 - (long)args->target) * 2) =
                   ~*(uint *)&args->source + iVar13;
            }
            *pUVar11 = L'~';
            *(undefined1 *)((long)plVar4 + 0x13) = 0;
            goto LAB_002ad66f;
          }
          *(undefined1 *)((long)plVar4 + 0x13) = 0;
          *err = U_ILLEGAL_ESCAPE_SEQUENCE;
          pUVar7->toUBytes[0] = '~';
          if (*(char *)((long)plVar4 + 0x11) == '\0') {
            iVar6 = '\x01';
            if ((char)bVar1 < '\0') goto LAB_002ad6d0;
          }
          else {
            iVar6 = '\x01';
            if (0x5d < (byte)(bVar1 - 0x21)) {
LAB_002ad6d0:
              pbVar12 = pbVar12 + 1;
              args->converter->toUBytes[1] = bVar1;
              iVar6 = '\x02';
            }
          }
          args->converter->toULength = iVar6;
          goto LAB_002ad6e3;
        }
        *(bool *)((long)plVar4 + 0x11) = bVar1 == 0x7b;
        if (*(char *)((long)plVar4 + 0x13) != '\0') {
          *(undefined1 *)((long)plVar4 + 0x13) = 0;
          *err = U_ILLEGAL_ESCAPE_SEQUENCE;
          pUVar7->toUCallbackReason = UCNV_IRREGULAR;
          pUVar7->toUBytes[0] = '~';
          args->converter->toUBytes[1] = bVar1;
          goto LAB_002ad6a5;
        }
        *(undefined1 *)((long)plVar4 + 0x13) = 1;
      }
    }
    else {
      if (*(char *)((long)plVar4 + 0x11) == '\0') {
        if (bVar1 != 0x7e) {
          *(undefined1 *)((long)plVar4 + 0x13) = 0;
          uVar5 = uVar10;
          if ((char)bVar1 < '\0') {
            *err = U_ILLEGAL_CHAR_FOUND;
LAB_002ad74e:
            uVar8 = (uint8_t)uVar10;
            pbVar12 = pbVar12 + 1;
LAB_002ad751:
            pUVar7->toUBytes[0] = uVar8;
            args->converter->toULength = '\x01';
            goto LAB_002ad6e3;
          }
LAB_002ad64b:
          if (args->offsets != (int32_t *)0x0) {
            *(int *)((long)args->offsets + ((long)pUVar11 - (long)args->target) * 2) =
                 iVar13 - ((int)*(char *)((long)plVar4 + 0x11) + *(int *)&args->source);
          }
          *pUVar11 = (UChar)uVar5;
LAB_002ad66f:
          pUVar11 = pUVar11 + 1;
          pbVar12 = pbVar12 + 1;
          pbVar14 = pbVar12;
          goto LAB_002ad4ff;
        }
      }
      else {
        uVar2 = pUVar7->toUnicodeStatus;
        if (uVar2 != 0) {
          uVar8 = (uint8_t)uVar2;
          if (((uVar2 + 0xdf & 0xff) < 0x5d) && ((byte)(bVar1 - 0x21) < 0x5e)) {
            tempBuf = (char  [2])(CONCAT11(bVar1,uVar8 + 0x80) | 0x8000);
            uVar5 = ucnv_MBCSSimpleGetNextUChar_63
                              (*(UConverterSharedData **)(*plVar4 + 0x30),tempBuf,2,
                               pUVar7->useFallback);
            pUVar7 = args->converter;
            pUVar7->toUnicodeStatus = 0;
            if ((int)uVar5 < 0xfffe) goto LAB_002ad64b;
            uVar10 = uVar10 | (uVar2 & 0xff) << 8;
            sVar9 = (short)uVar10;
            *err = (uint)(uVar5 != 0xfffe) * 2 + U_INVALID_CHAR_FOUND;
            if ((uVar2 & 0xff) == 0) goto LAB_002ad74e;
          }
          else {
            pUVar7->toUnicodeStatus = 0;
            *err = U_ILLEGAL_CHAR_FOUND;
            if ((byte)(bVar1 - 0x21) < 0x5e) goto LAB_002ad751;
            sVar9 = (ushort)bVar1 + (short)uVar2 * 0x100;
          }
          pUVar7->toUBytes[0] = (uint8_t)((ushort)sVar9 >> 8);
          args->converter->toUBytes[1] = (uint8_t)sVar9;
LAB_002ad6a5:
          args->converter->toULength = '\x02';
          pbVar12 = pbVar12 + 1;
          goto LAB_002ad6e3;
        }
        if (bVar1 != 0x7e) {
          pUVar7->toUnicodeStatus = uVar10 | 0x100;
          *(undefined1 *)((long)plVar4 + 0x13) = 0;
          goto LAB_002ad579;
        }
      }
      pUVar7->mode = 0x7e;
    }
LAB_002ad579:
    pbVar12 = pbVar12 + 1;
    pbVar14 = (byte *)(ulong)(iVar13 + 1);
  } while( true );
}

Assistant:

static void  U_CALLCONV
UConverter_toUnicode_HZ_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,
                                                            UErrorCode* err){
    char tempBuf[2];
    const char *mySource = ( char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    UChar32 targetUniChar = 0x0000;
    int32_t mySourceChar = 0x0000;
    UConverterDataHZ* myData=(UConverterDataHZ*)(args->converter->extraInfo);
    tempBuf[0]=0; 
    tempBuf[1]=0;

    /* Calling code already handles this situation. */
    /*if ((args->converter == NULL) || (args->targetLimit < args->target) || (mySourceLimit < args->source)){
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }*/
    
    while(mySource< mySourceLimit){
        
        if(myTarget < args->targetLimit){
            
            mySourceChar= (unsigned char) *mySource++;

            if(args->converter->mode == UCNV_TILDE) {
                /* second byte after ~ */
                args->converter->mode=0;
                switch(mySourceChar) {
                case 0x0A:
                    /* no output for ~\n (line-continuation marker) */
                    continue;
                case UCNV_TILDE:
                    if(args->offsets) {
                        args->offsets[myTarget - args->target]=(int32_t)(mySource - args->source - 2);
                    }
                    *(myTarget++)=(UChar)mySourceChar;
                    myData->isEmptySegment = FALSE;
                    continue;
                case UCNV_OPEN_BRACE:
                case UCNV_CLOSE_BRACE:
                    myData->isStateDBCS = (mySourceChar == UCNV_OPEN_BRACE);
                    if (myData->isEmptySegment) {
                        myData->isEmptySegment = FALSE; /* we are handling it, reset to avoid future spurious errors */
                        *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                        args->converter->toUCallbackReason = UCNV_IRREGULAR;
                        args->converter->toUBytes[0] = UCNV_TILDE;
                        args->converter->toUBytes[1] = static_cast<uint8_t>(mySourceChar);
                        args->converter->toULength = 2;
                        args->target = myTarget;
                        args->source = mySource;
                        return;
                    }
                    myData->isEmptySegment = TRUE;
                    continue;
                default:
                     /* if the first byte is equal to TILDE and the trail byte
                     * is not a valid byte then it is an error condition
                     */
                    /*
                     * Ticket 5691: consistent illegal sequences:
                     * - We include at least the first byte in the illegal sequence.
                     * - If any of the non-initial bytes could be the start of a character,
                     *   we stop the illegal sequence before the first one of those.
                     */
                    myData->isEmptySegment = FALSE; /* different error here, reset this to avoid spurious future error */
                    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                    args->converter->toUBytes[0] = UCNV_TILDE;
                    if( myData->isStateDBCS ?
                            (0x21 <= mySourceChar && mySourceChar <= 0x7e) :
                            mySourceChar <= 0x7f
                    ) {
                        /* The current byte could be the start of a character: Back it out. */
                        args->converter->toULength = 1;
                        --mySource;
                    } else {
                        /* Include the current byte in the illegal sequence. */
                        args->converter->toUBytes[1] = static_cast<uint8_t>(mySourceChar);
                        args->converter->toULength = 2;
                    }
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
            } else if(myData->isStateDBCS) {
                if(args->converter->toUnicodeStatus == 0x00){
                    /* lead byte */
                    if(mySourceChar == UCNV_TILDE) {
                        args->converter->mode = UCNV_TILDE;
                    } else {
                        /* add another bit to distinguish a 0 byte from not having seen a lead byte */
                        args->converter->toUnicodeStatus = (uint32_t) (mySourceChar | 0x100);
                        myData->isEmptySegment = FALSE; /* the segment has something, either valid or will produce a different error, so reset this */
                    }
                    continue;
                }
                else{
                    /* trail byte */
                    int leadIsOk, trailIsOk;
                    uint32_t leadByte = args->converter->toUnicodeStatus & 0xff;
                    targetUniChar = 0xffff;
                    /*
                     * Ticket 5691: consistent illegal sequences:
                     * - We include at least the first byte in the illegal sequence.
                     * - If any of the non-initial bytes could be the start of a character,
                     *   we stop the illegal sequence before the first one of those.
                     *
                     * In HZ DBCS, if the second byte is in the 21..7e range,
                     * we report only the first byte as the illegal sequence.
                     * Otherwise we convert or report the pair of bytes.
                     */
                    leadIsOk = (uint8_t)(leadByte - 0x21) <= (0x7d - 0x21);
                    trailIsOk = (uint8_t)(mySourceChar - 0x21) <= (0x7e - 0x21);
                    if (leadIsOk && trailIsOk) {
                        tempBuf[0] = (char) (leadByte+0x80) ;
                        tempBuf[1] = (char) (mySourceChar+0x80);
                        targetUniChar = ucnv_MBCSSimpleGetNextUChar(myData->gbConverter->sharedData,
                            tempBuf, 2, args->converter->useFallback);
                        mySourceChar= (leadByte << 8) | mySourceChar;
                    } else if (trailIsOk) {
                        /* report a single illegal byte and continue with the following DBCS starter byte */
                        --mySource;
                        mySourceChar = (int32_t)leadByte;
                    } else {
                        /* report a pair of illegal bytes if the second byte is not a DBCS starter */
                        /* add another bit so that the code below writes 2 bytes in case of error */
                        mySourceChar= 0x10000 | (leadByte << 8) | mySourceChar;
                    }
                    args->converter->toUnicodeStatus =0x00;
                }
            }
            else{
                if(mySourceChar == UCNV_TILDE) {
                    args->converter->mode = UCNV_TILDE;
                    continue;
                } else if(mySourceChar <= 0x7f) {
                    targetUniChar = (UChar)mySourceChar;  /* ASCII */
                    myData->isEmptySegment = FALSE; /* the segment has something valid */
                } else {
                    targetUniChar = 0xffff;
                    myData->isEmptySegment = FALSE; /* different error here, reset this to avoid spurious future error */
                }
            }
            if(targetUniChar < 0xfffe){
                if(args->offsets) {
                    args->offsets[myTarget - args->target]=(int32_t)(mySource - args->source - 1-(myData->isStateDBCS));
                }

                *(myTarget++)=(UChar)targetUniChar;
            }
            else /* targetUniChar>=0xfffe */ {
                if(targetUniChar == 0xfffe){
                    *err = U_INVALID_CHAR_FOUND;
                }
                else{
                    *err = U_ILLEGAL_CHAR_FOUND;
                }
                if(mySourceChar > 0xff){
                    args->converter->toUBytes[0] = (uint8_t)(mySourceChar >> 8);
                    args->converter->toUBytes[1] = (uint8_t)mySourceChar;
                    args->converter->toULength=2;
                }
                else{
                    args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                    args->converter->toULength=1;
                }
                break;
            }
        }
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    args->target = myTarget;
    args->source = mySource;
}